

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_detect.c
# Opt level: O3

void av1_invalidate_corner_list(CornerList *corners)

{
  if (corners != (CornerList *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)corners);
    corners->valid = false;
    pthread_mutex_unlock((pthread_mutex_t *)corners);
    return;
  }
  return;
}

Assistant:

void av1_invalidate_corner_list(CornerList *corners) {
  if (corners) {
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(&corners->mutex);
#endif  // CONFIG_MULTITHREAD
    corners->valid = false;
#if CONFIG_MULTITHREAD
    pthread_mutex_unlock(&corners->mutex);
#endif  // CONFIG_MULTITHREAD
  }
}